

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp.h
# Opt level: O2

void __thiscall kiste::cpp::escape(cpp *this,char *c)

{
  char cVar1;
  ostream *poVar2;
  
  cVar1 = *c;
  poVar2 = this->_os;
  if (cVar1 == '\n') {
    std::operator<<(poVar2,"\\n");
    return;
  }
  if (cVar1 != '\"') {
    if (cVar1 == '\\') {
      std::operator<<(poVar2,"\\\\");
      return;
    }
    std::operator<<(poVar2,cVar1);
    return;
  }
  std::operator<<(poVar2,"\\\"");
  return;
}

Assistant:

auto escape(const char& c) -> void
    {
      switch (c)
      {
      case '\\':
        _os << "\\\\";
        break;
      case '"':
        _os << "\\\"";
        break;
      case '\n':
        _os << "\\n";
        break;
      default:
        _os << c;
      }
    }